

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dbformat_test.cc
# Opt level: O2

void __thiscall leveldb::_Test_InternalKey_EncodeDecode::_Run(_Test_InternalKey_EncodeDecode *this)

{
  int iVar1;
  long lVar2;
  allocator local_59;
  long local_58;
  string local_50;
  
  for (local_58 = 0; local_58 != 4; local_58 = local_58 + 1) {
    iVar1 = (&DAT_0010b330)[local_58];
    for (lVar2 = 0; lVar2 != 0x60; lVar2 = lVar2 + 8) {
      std::__cxx11::string::string
                ((string *)&local_50,(char *)((long)&DAT_0010b330 + (long)iVar1),&local_59);
      TestKey(&local_50,*(uint64_t *)((long)&DAT_0010b340 + lVar2),kTypeValue);
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::string((string *)&local_50,"hello",&local_59);
      TestKey(&local_50,1,kTypeDeletion);
      std::__cxx11::string::~string((string *)&local_50);
    }
  }
  return;
}

Assistant:

TEST(FormatTest, InternalKey_EncodeDecode) {
  const char* keys[] = {"", "k", "hello", "longggggggggggggggggggggg"};
  const uint64_t seq[] = {1,
                          2,
                          3,
                          (1ull << 8) - 1,
                          1ull << 8,
                          (1ull << 8) + 1,
                          (1ull << 16) - 1,
                          1ull << 16,
                          (1ull << 16) + 1,
                          (1ull << 32) - 1,
                          1ull << 32,
                          (1ull << 32) + 1};
  for (int k = 0; k < sizeof(keys) / sizeof(keys[0]); k++) {
    for (int s = 0; s < sizeof(seq) / sizeof(seq[0]); s++) {
      TestKey(keys[k], seq[s], kTypeValue);
      TestKey("hello", 1, kTypeDeletion);
    }
  }
}